

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O3

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_close_result
          (connection<websocketpp::config::asio> *this)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  ostream *poVar1;
  size_t in_RCX;
  stringstream s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"Disconnect ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"close local:[",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  if ((this->m_local_close_reason)._M_string_length == 0) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  }
  else {
    std::operator+(&local_1d8,",",&this->m_local_close_reason);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] remote:[",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((this->m_remote_close_reason)._M_string_length == 0) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"");
  }
  else {
    std::operator+(&local_1b8,",",&this->m_remote_close_reason);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__cxx11::stringbuf::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,2,&local_1d8,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void connection<config>::log_close_result()
{
    std::stringstream s;

    s << "Disconnect "
      << "close local:[" << m_local_close_code
      << (m_local_close_reason.empty() ? "" : ","+m_local_close_reason)
      << "] remote:[" << m_remote_close_code
      << (m_remote_close_reason.empty() ? "" : ","+m_remote_close_reason) << "]";

    m_alog->write(log::alevel::disconnect,s.str());
}